

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1parse.c
# Opt level: O0

mbedtls_asn1_named_data *
mbedtls_asn1_find_named_data(mbedtls_asn1_named_data *list,char *oid,size_t len)

{
  int iVar1;
  size_t len_local;
  char *oid_local;
  mbedtls_asn1_named_data *list_local;
  
  oid_local = (char *)list;
  while ((oid_local != (char *)0x0 &&
         ((*(size_t *)(oid_local + 8) != len ||
          (iVar1 = memcmp(*(void **)(oid_local + 0x10),oid,len), iVar1 != 0))))) {
    oid_local = *(char **)(oid_local + 0x30);
  }
  return (mbedtls_asn1_named_data *)oid_local;
}

Assistant:

const mbedtls_asn1_named_data *mbedtls_asn1_find_named_data(const mbedtls_asn1_named_data *list,
                                                            const char *oid, size_t len)
{
    while (list != NULL) {
        if (list->oid.len == len &&
            memcmp(list->oid.p, oid, len) == 0) {
            break;
        }

        list = list->next;
    }

    return list;
}